

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgStack.h
# Opt level: O1

dgBigVector * __thiscall dgStack<dgBigVector>::operator[](dgStack<dgBigVector> *this,HaI32 entry)

{
  if (entry < 0) {
    __assert_fail("entry >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                  ,0x5f,"T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]");
  }
  if (this->m_size == 0 && entry == 0 || entry < this->m_size) {
    return (dgBigVector *)((ulong)(uint)entry * 0x20 + (long)(this->super_dgStackBase).m_ptr);
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,"T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]");
}

Assistant:

T& dgStack<T>::operator[] (hacd::HaI32 entry) 
{
	T *mem;

	HACD_ASSERT (entry >= 0);
	HACD_ASSERT ((entry < m_size) || ((m_size == 0) && (entry == 0)));

	mem = (T*) m_ptr;
	return mem[entry];
}